

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateTexture
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITexture *pTexture,Uint32 MipLevel,
          Uint32 Slice,Box *DstBox,TextureSubResData *SubresData,
          RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
          RESOURCE_STATE_TRANSITION_MODE TextureTransitionMode)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  Char *pCVar4;
  RenderPassVkImpl *pRVar5;
  undefined4 extraout_var;
  COMMAND_QUEUE_TYPE Type;
  undefined1 local_100 [8];
  string msg_4;
  string msg_3;
  undefined1 local_a0 [8];
  string msg_2;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  TextureSubResData *SubresData_local;
  Box *DstBox_local;
  Uint32 Slice_local;
  Uint32 MipLevel_local;
  ITexture *pTexture_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = SubresData;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_50,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"UpdateTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x736);
      std::__cxx11::string::~string((string *)local_50);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x736);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_TRANSFER);
  if (CVar2 != COMMAND_QUEUE_TYPE_TRANSFER) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[14],char[22],std::__cxx11::string,char[8]>
              ((string *)local_a0,(Diligent *)"UpdateTexture",(char (*) [14])0xcc2999,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
               (char (*) [8])SubresData);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x736);
    std::__cxx11::string::~string((string *)local_a0);
  }
  if (pTexture == (ITexture *)0x0) {
    FormatString<char[26]>((string *)((long)&msg_4.field_2 + 8),(char (*) [26])0xcc4a60);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x737);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  pRVar5 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar5 != (RenderPassVkImpl *)0x0) {
    FormatString<char[59]>
              ((string *)local_100,
               (char (*) [59])"UpdateTexture command must be used outside of render pass.");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x738);
    std::__cxx11::string::~string((string *)local_100);
  }
  iVar3 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  ValidateUpdateTextureParams
            ((TextureDesc *)CONCAT44(extraout_var,iVar3),MipLevel,Slice,DstBox,
             (TextureSubResData *)msg.field_2._8_8_);
  (this->m_Stats).CommandCounters.UpdateTexture = (this->m_Stats).CommandCounters.UpdateTexture + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UpdateTexture(
    ITexture*                      pTexture,
    Uint32                         MipLevel,
    Uint32                         Slice,
    const Box&                     DstBox,
    const TextureSubResData&       SubresData,
    RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
    RESOURCE_STATE_TRANSITION_MODE TextureTransitionMode)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_TRANSFER, "UpdateTexture");
    DEV_CHECK_ERR(pTexture != nullptr, "pTexture must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "UpdateTexture command must be used outside of render pass.");

    ValidateUpdateTextureParams(pTexture->GetDesc(), MipLevel, Slice, DstBox, SubresData);
    ++m_Stats.CommandCounters.UpdateTexture;
}